

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_fill_deviate_default
              (ly_ctx *ctx,lys_deviate *deviate,lys_node *dev_target,ly_set *dflt_check,char *value)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  ly_set *plVar4;
  int iVar5;
  size_t sVar6;
  lys_node **pplVar7;
  lys_node *plVar8;
  int local_64;
  uint u;
  int j;
  int i;
  int rc;
  lys_node_leaflist *llist;
  lys_node_leaf *leaf;
  lys_node_choice *choice;
  lys_node *node;
  char *value_local;
  ly_set *dflt_check_local;
  lys_node *dev_target_local;
  lys_deviate *deviate_local;
  ly_ctx *ctx_local;
  
  node = (lys_node *)value;
  value_local = (char *)dflt_check;
  dflt_check_local = (ly_set *)dev_target;
  dev_target_local = (lys_node *)deviate;
  deviate_local = (lys_deviate *)ctx;
  sVar6 = strlen(value);
  plVar4 = dflt_check_local;
  if (*(int *)&dflt_check_local[3].set == 2) {
    iVar5 = resolve_choice_default_schema_nodeid
                      ((char *)node,(lys_node *)dflt_check_local[4].set.s,(lys_node **)&choice);
    if ((iVar5 == 0) && (choice != (lys_node_choice *)0x0)) {
      if (*(int *)&dev_target_local->name == 3) {
        lVar2._0_4_ = plVar4[7].size;
        lVar2._4_4_ = plVar4[7].number;
        if ((lVar2 != 0) && (*(lys_node_choice **)(plVar4 + 7) == choice)) {
          plVar4[7].size = 0;
          plVar4[7].number = 0;
          local_64 = -1;
          while (local_64 = lys_ext_iter(*(lys_ext_instance ***)(dflt_check_local + 2),
                                         *(uint8_t *)((long)&dflt_check_local[1].set + 2),
                                         (char)local_64 + '\x01',LYEXT_SUBSTMT_DEFAULT),
                local_64 != -1) {
            lyp_ext_instance_rm((ly_ctx *)deviate_local,(lys_ext_instance ***)(dflt_check_local + 2)
                                ,(uint8_t *)((long)&dflt_check_local[1].set + 2),(uint8_t)local_64);
            local_64 = local_64 + -1;
          }
          return 0;
        }
        ly_vlog((ly_ctx *)deviate_local,LYE_INARG,LY_VLOG_NONE,(void *)0x0,node,"default");
        ly_vlog((ly_ctx *)deviate_local,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                "Value differs from the target being deleted.");
      }
      else {
        *(lys_node_choice **)(plVar4 + 7) = choice;
        lVar3._0_4_ = plVar4[7].size;
        lVar3._4_4_ = plVar4[7].number;
        if (lVar3 != 0) {
          return 0;
        }
        ly_vlog((ly_ctx *)deviate_local,LYE_INARG,LY_VLOG_NONE,(void *)0x0,node,"default");
      }
    }
    else {
      ly_vlog((ly_ctx *)deviate_local,LYE_INARG,LY_VLOG_NONE,(void *)0x0,node,"default");
    }
    return 1;
  }
  if (*(int *)&dflt_check_local[3].set == 4) {
    if (*(int *)&dev_target_local->name != 3) {
      lydict_remove((ly_ctx *)deviate_local,(char *)dflt_check_local[0xc].set.s);
      *(ushort *)&plVar4[1].set = *(ushort *)&plVar4[1].set & 0xefff;
      pplVar7 = (lys_node **)lydict_insert((ly_ctx *)deviate_local,(char *)node,sVar6 & 0xffffffff);
      plVar4[0xc].set.s = pplVar7;
      ly_set_add((ly_set *)value_local,dflt_check_local,0);
      return 0;
    }
    if ((dflt_check_local[0xc].set.s != (lys_node **)0x0) &&
       ((lys_node *)dflt_check_local[0xc].set.s == node)) {
      lydict_remove((ly_ctx *)deviate_local,(char *)dflt_check_local[0xc].set.s);
      plVar4[0xc].set.s = (lys_node **)0x0;
      *(ushort *)&plVar4[1].set = *(ushort *)&plVar4[1].set & 0xefff;
      local_64 = -1;
      while (local_64 = lys_ext_iter(*(lys_ext_instance ***)(dflt_check_local + 2),
                                     *(uint8_t *)((long)&dflt_check_local[1].set + 2),
                                     (char)local_64 + '\x01',LYEXT_SUBSTMT_DEFAULT), local_64 != -1)
      {
        lyp_ext_instance_rm((ly_ctx *)deviate_local,(lys_ext_instance ***)(dflt_check_local + 2),
                            (uint8_t *)((long)&dflt_check_local[1].set + 2),(uint8_t)local_64);
        local_64 = local_64 + -1;
      }
      return 0;
    }
    ly_vlog((ly_ctx *)deviate_local,LYE_INARG,LY_VLOG_NONE,(void *)0x0,node,"default");
    ly_vlog((ly_ctx *)deviate_local,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
            "Value differs from the target being deleted.");
    return 1;
  }
  if (*(int *)&dev_target_local->name != 3) {
    u = 0;
    while( true ) {
      if ((int)(uint)*(byte *)((long)&dflt_check_local[1].set + 6) <= (int)u) {
        plVar8 = (lys_node *)lydict_insert((ly_ctx *)deviate_local,(char *)node,sVar6 & 0xffffffff);
        pplVar7 = plVar4[0xc].set.s;
        bVar1 = *(byte *)((long)&plVar4[1].set + 6);
        *(byte *)((long)&plVar4[1].set + 6) = bVar1 + 1;
        pplVar7[bVar1] = plVar8;
        ly_set_add((ly_set *)value_local,dflt_check_local,0);
        *(ushort *)&plVar4[1].set = *(ushort *)&plVar4[1].set & 0xefff;
        return 0;
      }
      if (dflt_check_local[0xc].set.s[(int)u] == node) break;
      u = u + 1;
    }
    ly_vlog((ly_ctx *)deviate_local,LYE_INARG,LY_VLOG_NONE,(void *)0x0,node,"default");
    ly_vlog((ly_ctx *)deviate_local,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
            "Duplicated default value \"%s\".",node);
    return 1;
  }
  u = 0;
  while( true ) {
    if ((int)(uint)*(byte *)((long)&dflt_check_local[1].set + 6) <= (int)u) goto LAB_0017f0b8;
    if ((dflt_check_local[0xc].set.s[(int)u] != (lys_node *)0x0) &&
       (dflt_check_local[0xc].set.s[(int)u] == node)) break;
    u = u + 1;
  }
  lydict_remove((ly_ctx *)**(undefined8 **)(dflt_check_local + 3),
                (char *)dflt_check_local[0xc].set.s[(int)u]);
  plVar4[0xc].set.s[(int)u] = (lys_node *)0x0;
  local_64 = -1;
  while (local_64 = lys_ext_iter(*(lys_ext_instance ***)(dflt_check_local + 2),
                                 *(uint8_t *)((long)&dflt_check_local[1].set + 2),
                                 (char)local_64 + '\x01',LYEXT_SUBSTMT_DEFAULT), local_64 != -1) {
    if (*(byte *)(*(long *)(*(long *)(dflt_check_local + 2) + (long)local_64 * 8) + 0x1b) == u) {
      lyp_ext_instance_rm((ly_ctx *)deviate_local,(lys_ext_instance ***)(dflt_check_local + 2),
                          (uint8_t *)((long)&dflt_check_local[1].set + 2),(uint8_t)local_64);
      local_64 = local_64 + -1;
    }
    else if ((int)u < (int)(uint)*(byte *)(*(long *)(*(long *)(dflt_check_local + 2) +
                                                    (long)local_64 * 8) + 0x1b)) {
      lVar3 = *(long *)(*(long *)(dflt_check_local + 2) + (long)local_64 * 8);
      *(char *)(lVar3 + 0x1b) = *(char *)(lVar3 + 0x1b) + -1;
    }
  }
LAB_0017f0b8:
  if (u == *(byte *)((long)&plVar4[1].set + 6)) {
    ly_vlog((ly_ctx *)deviate_local,LYE_INARG,LY_VLOG_NONE,(void *)0x0,node,"default");
    ly_vlog((ly_ctx *)deviate_local,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
            "The default value to delete not found in the target node.");
    return 1;
  }
  return 0;
}

Assistant:

int
yang_fill_deviate_default(struct ly_ctx *ctx, struct lys_deviate *deviate, struct lys_node *dev_target,
                          struct ly_set *dflt_check, const char *value)
{
    struct lys_node *node;
    struct lys_node_choice *choice;
    struct lys_node_leaf *leaf;
    struct lys_node_leaflist *llist;
    int rc, i, j;
    unsigned int u;

    u = strlen(value);
    if (dev_target->nodetype == LYS_CHOICE) {
        choice = (struct lys_node_choice *)dev_target;
        rc = resolve_choice_default_schema_nodeid(value, choice->child, (const struct lys_node **)&node);
        if (rc || !node) {
            LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
            goto error;
        }
        if (deviate->mod == LY_DEVIATE_DEL) {
            if (!choice->dflt || (choice->dflt != node)) {
                LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Value differs from the target being deleted.");
                goto error;
            }
            choice->dflt = NULL;
            /* remove extensions of this default instance from the target node */
            j = -1;
            while ((j = lys_ext_iter(dev_target->ext, dev_target->ext_size, j + 1, LYEXT_SUBSTMT_DEFAULT)) != -1) {
                lyp_ext_instance_rm(ctx, &dev_target->ext, &dev_target->ext_size, j);
                --j;
            }
        } else { /* add or replace */
            choice->dflt = node;
            if (!choice->dflt) {
                /* default branch not found */
                LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                goto error;
            }
        }
    } else if (dev_target->nodetype == LYS_LEAF) {
        leaf = (struct lys_node_leaf *)dev_target;
        if (deviate->mod == LY_DEVIATE_DEL) {
            if (!leaf->dflt || !ly_strequal(leaf->dflt, value, 1)) {
                LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Value differs from the target being deleted.");
                goto error;
            }
            /* remove value */
            lydict_remove(ctx, leaf->dflt);
            leaf->dflt = NULL;
            leaf->flags &= ~LYS_DFLTJSON;
            /* remove extensions of this default instance from the target node */
            j = -1;
            while ((j = lys_ext_iter(dev_target->ext, dev_target->ext_size, j + 1, LYEXT_SUBSTMT_DEFAULT)) != -1) {
                lyp_ext_instance_rm(ctx, &dev_target->ext, &dev_target->ext_size, j);
                --j;
            }
        } else { /* add (already checked) and replace */
            /* remove value */
            lydict_remove(ctx, leaf->dflt);
            leaf->flags &= ~LYS_DFLTJSON;

            /* set new value */
            leaf->dflt = lydict_insert(ctx, value, u);

            /* remember to check it later (it may not fit now, but the type can be deviated too) */
            ly_set_add(dflt_check, dev_target, 0);
        }
    } else { /* LYS_LEAFLIST */
        llist = (struct lys_node_leaflist *)dev_target;
        if (deviate->mod == LY_DEVIATE_DEL) {
            /* find and remove the value in target list */
            for (i = 0; i < llist->dflt_size; i++) {
                if (llist->dflt[i] && ly_strequal(llist->dflt[i], value, 1)) {
                    /* match, remove the value */
                    lydict_remove(llist->module->ctx, llist->dflt[i]);
                    llist->dflt[i] = NULL;
                    /* remove extensions of this default instance from the target node */
                    j = -1;
                    while ((j = lys_ext_iter(dev_target->ext, dev_target->ext_size, j + 1, LYEXT_SUBSTMT_DEFAULT)) != -1) {
                        if (dev_target->ext[j]->insubstmt_index == i) {
                            lyp_ext_instance_rm(ctx, &dev_target->ext, &dev_target->ext_size, j);
                            --j;
                        } else if (dev_target->ext[j]->insubstmt_index > i) {
                            /* decrease the substatement index of the extension because of the changed array of defaults */
                            dev_target->ext[j]->insubstmt_index--;
                        }
                    }
                    break;
                }
            }
            if (i == llist->dflt_size) {
                LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "The default value to delete not found in the target node.");
                goto error;
            }
        } else {
            /* add or replace, anyway we place items into the deviate's list
               which propagates to the target */
            /* we just want to check that the value isn't already in the list */
            for (i = 0; i < llist->dflt_size; i++) {
                if (ly_strequal(llist->dflt[i], value, 1)) {
                    LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Duplicated default value \"%s\".", value);
                    goto error;
                }
            }
            /* store it in target node */
            llist->dflt[llist->dflt_size++] = lydict_insert(ctx, value, u);

            /* remember to check it later (it may not fit now, but the type can be deviated too) */
            ly_set_add(dflt_check, dev_target, 0);
            llist->flags &= ~LYS_DFLTJSON;
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}